

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

size_t uWS::protocol::formatMessage<true>
                 (char *dst,char *src,size_t length,OpCode opCode,size_t reportedLength,
                 bool compressed)

{
  unsigned_short uVar1;
  unsigned_long uVar2;
  byte in_CL;
  byte bVar3;
  size_t in_RDX;
  void *in_RSI;
  byte *in_RDI;
  ulong in_R8;
  byte in_R9B;
  char mask [4];
  int flags;
  uint64_t tmp_1;
  uint16_t tmp;
  size_t headerLength;
  size_t messageLength;
  long local_40;
  
  if (in_R8 < 0x7e) {
    local_40 = 2;
    in_RDI[1] = (byte)in_R8;
  }
  else if (in_R8 < 0x10000) {
    local_40 = 4;
    in_RDI[1] = 0x7e;
    uVar1 = cond_byte_swap<unsigned_short>((unsigned_short)in_R8);
    *(unsigned_short *)(in_RDI + 2) = uVar1;
  }
  else {
    local_40 = 10;
    in_RDI[1] = 0x7f;
    uVar2 = cond_byte_swap<unsigned_long>(in_R8);
    *(unsigned_long *)(in_RDI + 2) = uVar2;
  }
  bVar3 = 0;
  if ((in_R9B & 1) != 0) {
    bVar3 = 0x40;
  }
  *in_RDI = bVar3 | 0x80;
  *in_RDI = *in_RDI | in_CL;
  memcpy(in_RDI + local_40,in_RSI,in_RDX);
  return local_40 + in_RDX;
}

Assistant:

static inline size_t formatMessage(char *dst, const char *src, size_t length, OpCode opCode, size_t reportedLength, bool compressed) {
    size_t messageLength;
    size_t headerLength;
    if (reportedLength < 126) {
        headerLength = 2;
        dst[1] = (char) reportedLength;
    } else if (reportedLength <= UINT16_MAX) {
        headerLength = 4;
        dst[1] = 126;
        uint16_t tmp = cond_byte_swap<uint16_t>((uint16_t) reportedLength);
        memcpy(&dst[2], &tmp, sizeof(uint16_t));
    } else {
        headerLength = 10;
        dst[1] = 127;
        uint64_t tmp = cond_byte_swap<uint64_t>((uint64_t) reportedLength);
        memcpy(&dst[2], &tmp, sizeof(uint64_t));
    }

    int flags = 0;
    dst[0] = (char) ((flags & SND_NO_FIN ? 0 : 128) | (compressed ? SND_COMPRESSED : 0));
    if (!(flags & SND_CONTINUATION)) {
        dst[0] |= (char) opCode;
    }

    char mask[4];
    if (!isServer) {
        dst[1] |= 0x80;
        uint32_t random = rand();
        memcpy(mask, &random, 4);
        memcpy(dst + headerLength, &random, 4);
        headerLength += 4;
    }

    messageLength = headerLength + length;
    memcpy(dst + headerLength, src, length);

    if (!isServer) {

        // overwrites up to 3 bytes outside of the given buffer!
        //WebSocketProtocol<isServer>::unmaskInplace(dst + headerLength, dst + headerLength + length, mask);

        // this is not optimal
        char *start = dst + headerLength;
        char *stop = start + length;
        int i = 0;
        while (start != stop) {
            (*start++) ^= mask[i++ % 4];
        }
    }
    return messageLength;
}